

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_table_remove(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  TRef TVar4;
  MSize MVar5;
  TRef TVar6;
  ptrdiff_t pVar7;
  RecordIndex ix;
  
  puVar3 = J->base;
  uVar1 = *puVar3;
  rd->nres = 0;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    if ((*(byte *)((long)puVar3 + 7) & 0x1f) != 0) {
      recff_nyiu(J);
    }
    TVar4 = lj_ir_call(J,IRCALL_lj_tab_len,(ulong)uVar1);
    uVar2 = (rd->argv->u32).lo;
    MVar5 = lj_tab_len((GCtab *)(ulong)uVar2);
    TVar6 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = (ushort)(MVar5 != 0) << 8 | 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    lj_opt_fold(J);
    if (MVar5 != 0) {
      ix.tabv.field_2.it = 0xfffffff4;
      ix.keyv.n = (lua_Number)(int)MVar5;
      ix.idxchain = 0;
      ix.tabv.u32.lo = uVar2;
      ix.tab = uVar1;
      ix.key = TVar4;
      pVar7 = results_wanted(J);
      if (pVar7 != 0) {
        ix.val = 0;
        TVar4 = lj_record_idx(J,&ix);
        *J->base = TVar4;
        rd->nres = 1;
      }
      ix.val = 0x7fff;
      lj_record_idx(J,&ix);
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_remove(jit_State *J, RecordFFData *rd)
{
  TRef tab = J->base[0];
  rd->nres = 0;
  if (tref_istab(tab)) {
    if (tref_isnil(J->base[1])) {  /* Simple pop: t[#t] = nil */
      TRef trlen = lj_ir_call(J, IRCALL_lj_tab_len, tab);
      GCtab *t = tabV(&rd->argv[0]);
      MSize len = lj_tab_len(t);
      emitir(IRTGI(len ? IR_NE : IR_EQ), trlen, lj_ir_kint(J, 0));
      if (len) {
	RecordIndex ix;
	ix.tab = tab;
	ix.key = trlen;
	settabV(J->L, &ix.tabv, t);
	setintV(&ix.keyv, len);
	ix.idxchain = 0;
	if (results_wanted(J) != 0) {  /* Specialize load only if needed. */
	  ix.val = 0;
	  J->base[0] = lj_record_idx(J, &ix);  /* Load previous value. */
	  rd->nres = 1;
	  /* Assumes ix.key/ix.tab is not modified for raw lj_record_idx(). */
	}
	ix.val = TREF_NIL;
	lj_record_idx(J, &ix);  /* Remove value. */
      }
    } else {  /* Complex case: remove in the middle. */
      recff_nyiu(J);
    }
  }  /* else: Interpreter will throw. */
}